

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O0

void __thiscall PyreNet::Perceptron::mutate_uniform(Perceptron *this,double lower,double upper)

{
  bool bVar1;
  RandomGenerator *this_00;
  reference pdVar2;
  double dVar3;
  double *weight;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  RandomGenerator *randomGenerator;
  double upper_local;
  double lower_local;
  Perceptron *this_local;
  
  this_00 = RandomGenerator::getInstance();
  __end1 = std::vector<double,_std::allocator<double>_>::begin(&this->weights);
  weight = (double *)std::vector<double,_std::allocator<double>_>::end(&this->weights);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&weight);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dVar3 = RandomGenerator::generate_uniform(this_00,lower,upper);
    *pdVar2 = dVar3 + *pdVar2;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Perceptron::mutate_uniform(const double lower, const double upper) {
        RandomGenerator *randomGenerator = RandomGenerator::getInstance();
        for (double &weight : this->weights) {
            weight += randomGenerator->generate_uniform(lower, upper);
        }
    }